

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

void __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
::Initialize(WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
             *this,int capacity)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  Recycler *pRVar7;
  undefined4 *puVar8;
  int *__s;
  WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
  *pWVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  undefined1 local_70 [8];
  TrackAllocData data;
  int modIndex;
  
  data._36_4_ = 0x4b;
  uVar5 = PrimePolicy::GetPrime(capacity,(int *)&data.field_0x24);
  uVar12 = (ulong)(int)uVar5;
  local_70 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18ff27;
  data.filename._0_4_ = 0x1bd;
  data.plusSize = uVar12;
  pRVar7 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  if (uVar5 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar7,(TrackAllocData *)0x0);
    __s = (int *)&DAT_00000008;
  }
  else {
    sVar11 = 0xffffffffffffffff;
    if (-1 < (int)uVar5) {
      sVar11 = uVar12 * 4;
    }
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_007bc614;
      *puVar8 = 0;
    }
    __s = (int *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                           (pRVar7,sVar11);
    if (__s == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) goto LAB_007bc614;
      *puVar8 = 0;
      __s = (int *)0x0;
    }
  }
  local_70 = (undefined1  [8])
             &WeakRefDictionaryEntry<Js::PropertyRecord_const,Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_18ff27;
  data.filename._0_4_ = 0x1be;
  data.plusSize = uVar12;
  pRVar7 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_70);
  if (uVar5 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(pRVar7,(TrackAllocData *)0x0);
    pWVar9 = (WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
              *)&DAT_00000008;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar12;
    sVar11 = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      sVar11 = SUB168(auVar2 * ZEXT816(0x18),0);
    }
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar4) goto LAB_007bc614;
      *puVar8 = 0;
    }
    if (sVar11 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                         "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar4) goto LAB_007bc614;
      *puVar8 = 0;
    }
    pWVar9 = (WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
              *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                          (pRVar7,sVar11);
    if (pWVar9 == (WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
                   *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar4) {
LAB_007bc614:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    lVar10 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(pWVar9->key).ptr + lVar10);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar10 = lVar10 + 0x18;
    } while (uVar12 * 0x18 != lVar10);
  }
  if ((__s != (int *)0x0) &&
     (pWVar9 != (WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
                 *)0x0)) {
    this->size = uVar5;
    Memory::Recycler::WBSetBit((char *)&this->buckets);
    (this->buckets).ptr = __s;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->buckets);
    if (0 < (int)uVar5) {
      memset(__s,0xff,(ulong)uVar5 << 2);
    }
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = pWVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->freeList = -1;
    this->modFunctionIndex = data._36_4_;
  }
  return;
}

Assistant:

void Initialize(int capacity)
        {
            int modIndex = UNKNOWN_MOD_INDEX;
            int size = PrimePolicy::GetSize(capacity, &modIndex);

            int* buckets = RecyclerNewArrayLeaf(recycler, int, size);
            EntryType * entries = RecyclerNewArray(recycler, EntryType, size);

            // No need for auto pointers here since these are both recycler
            // allocated objects
            if (buckets != nullptr && entries != nullptr)
            {
                this->size = size;
                this->buckets = buckets;
                for (int i = 0; i < size; i++) buckets[i] = -1;
                this->entries = entries;
                this->freeList = -1;
                this->modFunctionIndex = modIndex;
            }
        }